

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

JavascriptPromise *
Js::JavascriptPromise::InitializePromise_TTD
          (ScriptContext *scriptContext,uint32 status,bool isHandled,Var result,
          SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *resolveReactions
          ,SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *rejectReactions
          )

{
  Recycler *this;
  code *pcVar1;
  JavascriptPromise *pJVar2;
  Recycler *alloc;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *ptr;
  undefined4 *puVar3;
  Type *ppJVar4;
  undefined7 in_register_00000011;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *pSVar5;
  bool bVar6;
  bool bVar7;
  undefined1 local_98 [8];
  TrackAllocData data;
  JavascriptPromiseReactionPair pair;
  Iterator local_48;
  JavascriptPromise *local_38;
  
  this = scriptContext->recycler;
  pJVar2 = JavascriptLibrary::CreatePromise
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  pJVar2->status = (Type)status;
  if ((int)CONCAT71(in_register_00000011,isHandled) != 0) {
    pJVar2->isHandled = true;
  }
  local_38 = pJVar2;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&pJVar2->result,result);
  local_98 = (undefined1  [8])
             &SList<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_79c5325;
  data.filename._0_4_ = 0x721;
  alloc = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_98);
  pSVar5 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0;
  ptr = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
        new<Memory::Recycler>(0x18,alloc,0x37a1d4);
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::SListBase
            ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)ptr);
  ptr->allocator = this;
  Memory::WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>::
  WriteBarrierSet(&pJVar2->reactions,ptr);
  data.typeinfo =
       (type_info *)
       (resolveReactions->
       super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>).
       super_SListNodeBase<Memory::HeapAllocator>.next;
  bVar6 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)data.typeinfo
          != resolveReactions;
  if (!bVar6) {
    data.typeinfo = (type_info *)pSVar5;
  }
  local_48.current =
       (rejectReactions->
       super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>).
       super_SListNodeBase<Memory::HeapAllocator>.next;
  bVar7 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
          local_48.current != rejectReactions;
  if (!bVar7) {
    local_48.current = (NodeBase *)pSVar5;
  }
  local_98 = (undefined1  [8])resolveReactions;
  local_48.list =
       &rejectReactions->
        super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while ((bVar6 && (bVar7))) {
    ppJVar4 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Iterator
              ::Data((Iterator *)local_98);
    data._32_8_ = *ppJVar4;
    SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::Iterator::Data
              (&local_48);
    SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Prepend
              ((pJVar2->reactions).ptr,(JavascriptPromiseReactionPair *)&data.line);
    if (data.typeinfo == (type_info *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar3 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar6) goto LAB_00b9fb17;
      *puVar3 = 0;
    }
    bVar6 = (undefined1  [8])
            *(SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> **)
             data.typeinfo != local_98;
    data.typeinfo =
         (type_info *)
         *(SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> **)data.typeinfo
    ;
    if (!bVar6) {
      data.typeinfo = (type_info *)pSVar5;
    }
    if ((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)local_48.current
        == (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar3 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar7) goto LAB_00b9fb17;
      *puVar3 = 0;
    }
    local_48.current =
         (((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
          local_48.current)->
         super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>).
         super_SListNodeBase<Memory::HeapAllocator>.next;
    bVar7 = (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
            local_48.current != local_48.list;
    if (!bVar7) {
      local_48.current = (NodeBase *)pSVar5;
    }
  }
  if (bVar6 || bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x730,"(hasResolve == false && hasReject == false)",
                                "mismatched resolve/reject reaction counts");
    if (!bVar6) {
LAB_00b9fb17:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar2 = local_38;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Reverse
            (&((local_38->reactions).ptr)->
              super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>);
  return pJVar2;
}

Assistant:

JavascriptPromise* JavascriptPromise::InitializePromise_TTD(ScriptContext* scriptContext, uint32 status, bool isHandled, Var result, SList<Js::JavascriptPromiseReaction*, HeapAllocator>& resolveReactions,SList<Js::JavascriptPromiseReaction*, HeapAllocator>& rejectReactions)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromise* promise = library->CreatePromise();

        promise->SetStatus((PromiseStatus)status);
        if (isHandled)
        {
            promise->SetIsHandled();
        }
        promise->result = result;

        promise->reactions = RecyclerNew(recycler, JavascriptPromiseReactionList, recycler);
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator resolveIterator = resolveReactions.GetIterator();
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator rejectIterator = rejectReactions.GetIterator();

        bool hasResolve = resolveIterator.Next();
        bool hasReject = rejectIterator.Next();
        while (hasResolve && hasReject)
        {
            JavascriptPromiseReactionPair pair;
            pair.resolveReaction = resolveIterator.Data();
            pair.rejectReaction = rejectIterator.Data();
            promise->reactions->Prepend(pair);
            hasResolve = resolveIterator.Next();
            hasReject = rejectIterator.Next();
        }
        AssertMsg(hasResolve == false && hasReject == false, "mismatched resolve/reject reaction counts");
        promise->reactions->Reverse();

        return promise;
    }